

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_warc.c
# Opt level: O0

void test_write_format_warc(void)

{
  int iVar1;
  la_ssize_t lVar2;
  size_t local_70;
  size_t used;
  char *buff;
  size_t bsiz;
  archive_entry *ae;
  archive *a;
  char filedata [64];
  
  buff = (char *)0x800;
  used = (size_t)malloc(0x800);
  ae = (archive_entry *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'5',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_warc((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'6',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_warc(a)",ae);
  iVar1 = archive_write_add_filter_none((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",ae);
  iVar1 = archive_write_open_memory((archive *)ae,(void *)used,0x800,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'9',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, bsiz, &used)",ae);
  bsiz = (size_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'>',(uint)((archive_entry *)bsiz != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname((archive_entry *)bsiz,"test");
  archive_entry_set_filetype((archive_entry *)bsiz,0x8000);
  archive_entry_set_size((archive_entry *)bsiz,9);
  iVar1 = archive_write_header((archive *)ae,(archive_entry *)bsiz);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
  archive_entry_free((archive_entry *)bsiz);
  lVar2 = archive_write_data((archive *)ae,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'D',9,"9",lVar2,"archive_write_data(a, \"12345678\", 9)",ae);
  iVar1 = archive_write_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ae);
  iVar1 = archive_write_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'K',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_warc((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_warc(a)",ae);
  test_read((archive *)ae,(char *)used,local_70,(char *)&a);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'O',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_by_code((archive *)ae,0xf0000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'P',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_support_format_by_code(a, ARCHIVE_FORMAT_WARC)",ae);
  test_read((archive *)ae,(char *)used,local_70,(char *)&a);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'S',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_set_format((archive *)ae,0xf0000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'T',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_format(a, ARCHIVE_FORMAT_WARC)",ae);
  test_read((archive *)ae,(char *)used,local_70,(char *)&a);
  ae = (archive_entry *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'X',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_warc((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_warc(a)",ae);
  iVar1 = archive_write_add_filter_none((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'Z',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",ae);
  iVar1 = archive_write_open_memory((archive *)ae,(void *)used,0x800,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\\',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, bsiz, &used)",ae);
  bsiz = (size_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'_',(uint)((archive_entry *)bsiz != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname((archive_entry *)bsiz,"test");
  archive_entry_set_filetype((archive_entry *)bsiz,0x8000);
  archive_entry_set_size((archive_entry *)bsiz,9);
  iVar1 = archive_write_header((archive *)ae,(archive_entry *)bsiz);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
  archive_entry_free((archive_entry *)bsiz);
  lVar2 = archive_write_data((archive *)ae,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'e',9,"9",lVar2,"archive_write_data(a, \"12345678\", 9)",ae);
  bsiz = (size_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'h',(uint)((archive_entry *)bsiz != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname((archive_entry *)bsiz,"test2");
  archive_entry_set_filetype((archive_entry *)bsiz,0x8000);
  archive_entry_set_size((archive_entry *)bsiz,9);
  iVar1 = archive_write_header((archive *)ae,(archive_entry *)bsiz);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'l',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
  archive_entry_free((archive_entry *)bsiz);
  lVar2 = archive_write_data((archive *)ae,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'n',9,"9",lVar2,"archive_write_data(a, \"12345678\", 9)",ae);
  iVar1 = archive_write_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ae);
  iVar1 = archive_write_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  ae = (archive_entry *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L't',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_warc((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'u',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_warc(a)",ae);
  iVar1 = archive_write_add_filter_none((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'v',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",ae);
  iVar1 = archive_write_open_memory((archive *)ae,(void *)used,0x800,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'x',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, bsiz, &used)",ae);
  bsiz = (size_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'{',(uint)((archive_entry *)bsiz != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)bsiz,"dir");
  archive_entry_set_filetype((archive_entry *)bsiz,0x4000);
  archive_entry_set_size((archive_entry *)bsiz,0x200);
  iVar1 = archive_write_header((archive *)ae,(archive_entry *)bsiz);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x7f',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",ae);
  archive_entry_free((archive_entry *)bsiz);
  iVar1 = archive_write_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ae);
  iVar1 = archive_write_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                   ,L'\x86',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
  iVar1 = archive_read_support_filter_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae);
  iVar1 = archive_read_open_memory((archive *)ae,(void *)used,local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x89',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      ae);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&bsiz);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x8c',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  iVar1 = archive_read_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",ae);
  iVar1 = archive_read_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x8e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  free((void *)used);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_warc)
{
	char filedata[64];
	struct archive *a;
	struct archive_entry *ae;
	const size_t bsiz = 2048U;
	char *buff;
	size_t used;

	buff = malloc(bsiz);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_warc(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, bsiz, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "test");
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, 9);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 9, archive_write_data(a, "12345678", 9));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Read from it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_warc(a));
	test_read(a, buff, used, filedata);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_by_code(a, ARCHIVE_FORMAT_WARC));
	test_read(a, buff, used, filedata);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_set_format(a, ARCHIVE_FORMAT_WARC));
	test_read(a, buff, used, filedata);

	/* Create a new archive */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_warc(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, bsiz, &used));

	/* write first file: that should succeed */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "test");
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, 9);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 9, archive_write_data(a, "12345678", 9));

	/* write second file: should succeed as well */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "test2");
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, 9);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 9, archive_write_data(a, "12345678", 9));

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Create a new archive */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_warc(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, bsiz, &used));

	/* write a directory: this should fail */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_filetype(ae, AE_IFDIR);
	archive_entry_set_size(ae, 512);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* test whether last archive is indeed empty */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/* Test EOF */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(buff);
}